

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O3

Rect __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,int width,int height,bool merge,
          FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  uint *puVar1;
  Rect *pRVar2;
  uint uVar3;
  Rect RVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int freeNodeIndex;
  Rect newRect;
  uint local_3c;
  Rect local_38;
  
  local_3c = 0;
  local_38 = FindPositionForNewNode(this,width,height,rectChoice,(int *)&local_3c);
  uVar3 = local_3c;
  if (local_38._8_8_ >> 0x20 != 0) {
    uVar7 = (ulong)local_3c;
    SplitFreeRectByHeuristic
              (this,(this->freeRectangles).Array + (int)local_3c,&local_38,splitMethod);
    uVar6 = (this->freeRectangles).Count;
    if (uVar3 < uVar6) {
      uVar6 = uVar6 - 1;
      (this->freeRectangles).Count = uVar6;
      if (uVar3 < uVar6) {
        pRVar2 = (this->freeRectangles).Array;
        memmove(pRVar2 + uVar7,pRVar2 + uVar7 + 1,(ulong)(uVar6 - uVar3) << 4);
      }
    }
    if (merge) {
      MergeFreeList(this);
    }
    TArray<Rect,_Rect>::Grow(&this->usedRectangles,1);
    RVar4 = local_38;
    pRVar2 = (this->usedRectangles).Array + (this->usedRectangles).Count;
    pRVar2->x = local_38.x;
    pRVar2->y = local_38.y;
    pRVar2->width = local_38.width;
    pRVar2->height = local_38.height;
    puVar1 = &(this->usedRectangles).Count;
    *puVar1 = *puVar1 + 1;
    local_38 = RVar4;
    bVar5 = DisjointRectCollection::Add(&this->disjointRects,&local_38);
    if (!bVar5) {
      __assert_fail("disjointRects.Add(newRect) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                    ,0x169,
                    "Rect GuillotineBinPack::Insert(int, int, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                   );
    }
  }
  return local_38;
}

Assistant:

Rect GuillotineBinPack::Insert(int width, int height, bool merge, FreeRectChoiceHeuristic rectChoice, 
	GuillotineSplitHeuristic splitMethod)
{
	// Find where to put the new rectangle.
	int freeNodeIndex = 0;
	Rect newRect = FindPositionForNewNode(width, height, rectChoice, &freeNodeIndex);

	// Abort if we didn't have enough space in the bin.
	if (newRect.height == 0)
		return newRect;

	// Remove the space that was just consumed by the new rectangle.
	SplitFreeRectByHeuristic(freeRectangles[freeNodeIndex], newRect, splitMethod);
	freeRectangles.Delete(freeNodeIndex);

	// Perform a Rectangle Merge step if desired.
	if (merge)
		MergeFreeList();

	// Remember the new used rectangle.
	usedRectangles.Push(newRect);

	// Check that we're really producing correct packings here.
#ifdef _DEBUG
	assert(disjointRects.Add(newRect) == true);
#endif
	return newRect;
}